

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswAig.c
# Opt level: O3

Aig_Man_t * Ssw_FramesWithClasses(Ssw_Man_t *p)

{
  void *pvVar1;
  Vec_Int_t *pVVar2;
  Aig_Man_t *p_00;
  Aig_Obj_t *pAVar3;
  ulong uVar4;
  Aig_Man_t *pAVar5;
  uint uVar6;
  uint uVar7;
  Vec_Ptr_t *pVVar8;
  int iVar9;
  Aig_Obj_t *p1;
  int iVar10;
  int iVar11;
  Aig_Obj_t *pAVar12;
  uint uVar13;
  long lVar14;
  
  if (p->pFrames != (Aig_Man_t *)0x0) {
    __assert_fail("p->pFrames == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswAig.c"
                  ,0x95,"Aig_Man_t *Ssw_FramesWithClasses(Ssw_Man_t *)");
  }
  pAVar5 = p->pAig;
  if (pAVar5->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(p->pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswAig.c"
                  ,0x96,"Aig_Man_t *Ssw_FramesWithClasses(Ssw_Man_t *)");
  }
  if (pAVar5->nObjs[2] <= pAVar5->nRegs) {
    __assert_fail("Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswAig.c"
                  ,0x97,"Aig_Man_t *Ssw_FramesWithClasses(Ssw_Man_t *)");
  }
  p->nConstrTotal = 0;
  p->nConstrReduced = 0;
  p_00 = Aig_ManStart(p->nFrames * pAVar5->vObjs->nSize);
  pAVar5 = p->pAig;
  if (0 < pAVar5->nRegs) {
    iVar10 = 0;
    do {
      uVar6 = pAVar5->nTruePis + iVar10;
      if (((int)uVar6 < 0) || (pAVar5->vCis->nSize <= (int)uVar6)) goto LAB_005e04fd;
      pvVar1 = pAVar5->vCis->pArray[uVar6];
      pAVar3 = Aig_ObjCreateCi(p_00);
      p->pNodeToFrames[(long)*(int *)((long)pvVar1 + 0x24) * (long)p->nFrames] = pAVar3;
      iVar10 = iVar10 + 1;
      pAVar5 = p->pAig;
    } while (iVar10 < pAVar5->nRegs);
  }
  if (p->pPars->nFramesK < 1) {
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    iVar10 = 0;
    do {
      p->pNodeToFrames[pAVar5->pConst1->Id * p->nFrames + iVar10] = p_00->pConst1;
      pAVar5 = p->pAig;
      if (0 < pAVar5->nTruePis) {
        lVar14 = 0;
        do {
          if (pAVar5->vCis->nSize <= lVar14) goto LAB_005e04fd;
          pvVar1 = pAVar5->vCis->pArray[lVar14];
          pAVar3 = Aig_ObjCreateCi(p_00);
          pVVar2 = p->vInits;
          if (pVVar2 == (Vec_Int_t *)0x0) {
            uVar4 = 0;
          }
          else {
            if (((int)uVar6 < 0) || (pVVar2->nSize <= (int)uVar6)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar4 = (ulong)uVar6;
            uVar6 = uVar6 + 1;
            uVar4 = (ulong)(pVVar2->pArray[uVar4] != 0) << 3;
          }
          *(ulong *)&pAVar3->field_0x18 = *(ulong *)&pAVar3->field_0x18 & 0xfffffffffffffff7 | uVar4
          ;
          p->pNodeToFrames[*(int *)((long)pvVar1 + 0x24) * p->nFrames + iVar10] = pAVar3;
          lVar14 = lVar14 + 1;
          pAVar5 = p->pAig;
        } while (lVar14 < pAVar5->nTruePis);
      }
      if (0 < pAVar5->nRegs) {
        iVar11 = 0;
        do {
          uVar7 = pAVar5->nTruePis + iVar11;
          if (((int)uVar7 < 0) || (pAVar5->vCis->nSize <= (int)uVar7)) goto LAB_005e04fd;
          Ssw_FramesConstrainNode
                    (p,p_00,(Aig_Man_t *)pAVar5->pReprs,(Aig_Obj_t *)pAVar5->vCis->pArray[uVar7],
                     iVar10,1);
          iVar11 = iVar11 + 1;
          pAVar5 = p->pAig;
        } while (iVar11 < pAVar5->nRegs);
      }
      pVVar8 = pAVar5->vObjs;
      if (0 < pVVar8->nSize) {
        lVar14 = 0;
        do {
          pAVar3 = (Aig_Obj_t *)pVVar8->pArray[lVar14];
          if ((pAVar3 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar3->field_0x18 & 7) - 7))
          {
            if (((ulong)pAVar3 & 1) != 0) goto LAB_005e051c;
            uVar4 = (ulong)pAVar3->pFanin0 & 0xfffffffffffffffe;
            if (uVar4 == 0) {
              pAVar12 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar12 = (Aig_Obj_t *)
                        ((ulong)((uint)pAVar3->pFanin0 & 1) ^
                        (ulong)p->pNodeToFrames[*(int *)(uVar4 + 0x24) * p->nFrames + iVar10]);
            }
            uVar4 = (ulong)pAVar3->pFanin1 & 0xfffffffffffffffe;
            if (uVar4 == 0) {
              p1 = (Aig_Obj_t *)0x0;
            }
            else {
              p1 = (Aig_Obj_t *)
                   ((ulong)((uint)pAVar3->pFanin1 & 1) ^
                   (ulong)p->pNodeToFrames[*(int *)(uVar4 + 0x24) * p->nFrames + iVar10]);
            }
            pAVar12 = Aig_And(p_00,pAVar12,p1);
            p->pNodeToFrames[pAVar3->Id * p->nFrames + iVar10] = pAVar12;
            Ssw_FramesConstrainNode(p,p_00,(Aig_Man_t *)p->pAig->pReprs,pAVar3,iVar10,1);
            pAVar5 = p->pAig;
          }
          lVar14 = lVar14 + 1;
          pVVar8 = pAVar5->vObjs;
        } while (lVar14 < pVVar8->nSize);
      }
      pVVar8 = pAVar5->vCos;
      if (0 < pVVar8->nSize) {
        lVar14 = 0;
        do {
          pvVar1 = pVVar8->pArray[lVar14];
          if (((ulong)pvVar1 & 1) != 0) {
LAB_005e051c:
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswInt.h"
                          ,0xb9,"Aig_Obj_t *Ssw_ObjChild0Fra(Ssw_Man_t *, Aig_Obj_t *, int)");
          }
          uVar4 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
          if (uVar4 == 0) {
            pAVar3 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar3 = (Aig_Obj_t *)
                     ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^
                     (ulong)p->pNodeToFrames[*(int *)(uVar4 + 0x24) * p->nFrames + iVar10]);
          }
          p->pNodeToFrames[p->nFrames * *(int *)((long)pvVar1 + 0x24) + iVar10] = pAVar3;
          lVar14 = lVar14 + 1;
          pAVar5 = p->pAig;
          pVVar8 = pAVar5->vCos;
        } while (lVar14 < pVVar8->nSize);
      }
      iVar11 = iVar10 + 1;
      if (0 < pAVar5->nRegs) {
        iVar9 = 0;
        do {
          uVar7 = pAVar5->nTruePos + iVar9;
          if (((((int)uVar7 < 0) || (pAVar5->vCos->nSize <= (int)uVar7)) ||
              (uVar13 = pAVar5->nTruePis + iVar9, (int)uVar13 < 0)) ||
             (pAVar5->vCis->nSize <= (int)uVar13)) goto LAB_005e04fd;
          p->pNodeToFrames
          [p->nFrames * *(int *)((long)pAVar5->vCis->pArray[uVar13] + 0x24) + iVar11] =
               p->pNodeToFrames
               [*(int *)((long)pAVar5->vCos->pArray[uVar7] + 0x24) * p->nFrames + iVar10];
          iVar9 = iVar9 + 1;
          pAVar5 = p->pAig;
        } while (iVar9 < pAVar5->nRegs);
      }
      iVar10 = iVar11;
    } while (iVar11 < p->pPars->nFramesK);
  }
  if ((p->vInits != (Vec_Int_t *)0x0) && (p->vInits->nSize != uVar6 + pAVar5->nTruePis)) {
    __assert_fail("p->vInits == NULL || Vec_IntSize(p->vInits) == iLits + Saig_ManPiNum(p->pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswAig.c"
                  ,0xbc,"Aig_Man_t *Ssw_FramesWithClasses(Ssw_Man_t *)");
  }
  if (0 < pAVar5->nRegs) {
    iVar10 = 0;
    do {
      uVar6 = pAVar5->nTruePis + iVar10;
      if (((int)uVar6 < 0) || (pAVar5->vCis->nSize <= (int)uVar6)) {
LAB_005e04fd:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Aig_ObjCreateCo(p_00,p->pNodeToFrames
                           [(long)*(int *)((long)pAVar5->vCis->pArray[uVar6] + 0x24) *
                            (long)p->nFrames + (long)p->pPars->nFramesK]);
      iVar10 = iVar10 + 1;
      pAVar5 = p->pAig;
    } while (iVar10 < pAVar5->nRegs);
  }
  Aig_ManCleanup(p_00);
  if (p_00->pData != (void *)0x0) {
    __assert_fail("pFrames->pData == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswAig.c"
                  ,0xc4,"Aig_Man_t *Ssw_FramesWithClasses(Ssw_Man_t *)");
  }
  return p_00;
}

Assistant:

Aig_Man_t * Ssw_FramesWithClasses( Ssw_Man_t * p )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pObjNew;
    int i, f, iLits;
    assert( p->pFrames == NULL );
    assert( Aig_ManRegNum(p->pAig) > 0 );
    assert( Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig) );
    p->nConstrTotal = p->nConstrReduced = 0;

    // start the fraig package
    pFrames = Aig_ManStart( Aig_ManObjNumMax(p->pAig) * p->nFrames );
    // create latches for the first frame
    Saig_ManForEachLo( p->pAig, pObj, i )
        Ssw_ObjSetFrame( p, pObj, 0, Aig_ObjCreateCi(pFrames) );
    // add timeframes
    iLits = 0;
    for ( f = 0; f < p->pPars->nFramesK; f++ )
    {
        // map constants and PIs
        Ssw_ObjSetFrame( p, Aig_ManConst1(p->pAig), f, Aig_ManConst1(pFrames) );
        Saig_ManForEachPi( p->pAig, pObj, i )
        {
            pObjNew = Aig_ObjCreateCi(pFrames);
            pObjNew->fPhase = (p->vInits != NULL) && Vec_IntEntry(p->vInits, iLits++);
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
        }
        // set the constraints on the latch outputs
        Saig_ManForEachLo( p->pAig, pObj, i )
            Ssw_FramesConstrainNode( p, pFrames, p->pAig, pObj, f, 1 );
        // add internal nodes of this frame
        Aig_ManForEachNode( p->pAig, pObj, i )
        {
            pObjNew = Aig_And( pFrames, Ssw_ObjChild0Fra(p, pObj, f), Ssw_ObjChild1Fra(p, pObj, f) );
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
            Ssw_FramesConstrainNode( p, pFrames, p->pAig, pObj, f, 1 );
        }
        // transfer to the primary outputs
        Aig_ManForEachCo( p->pAig, pObj, i )
            Ssw_ObjSetFrame( p, pObj, f, Ssw_ObjChild0Fra(p, pObj,f) );
        // transfer latch input to the latch outputs
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
            Ssw_ObjSetFrame( p, pObjLo, f+1, Ssw_ObjFrame(p, pObjLi,f) );
    }
    assert( p->vInits == NULL || Vec_IntSize(p->vInits) == iLits + Saig_ManPiNum(p->pAig) );
    // add the POs for the latch outputs of the last frame
    Saig_ManForEachLo( p->pAig, pObj, i )
        Aig_ObjCreateCo( pFrames, Ssw_ObjFrame( p, pObj, p->pPars->nFramesK ) );

    // remove dangling nodes
    Aig_ManCleanup( pFrames );
    // make sure the satisfying assignment is node assigned
    assert( pFrames->pData == NULL );
//Aig_ManShow( pFrames, 0, NULL );
    return pFrames;
}